

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cse.c
# Opt level: O0

void clean_up_insns(dmr_C *C,entrypoint *ep)

{
  undefined1 local_58 [8];
  ptr_list_iter insniter__;
  instruction *insn;
  ptr_list_iter bbiter__;
  basic_block *bb;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  ptrlist_forward_iterator((ptr_list_iter *)&insn,(ptr_list *)ep->bbs);
  bbiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&insn);
  while (bbiter__._16_8_ != 0) {
    ptrlist_forward_iterator((ptr_list_iter *)local_58,*(ptr_list **)(bbiter__._16_8_ + 0x30));
    insniter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_58);
    while (insniter__._16_8_ != 0) {
      clean_up_one_instruction(C,(basic_block *)bbiter__._16_8_,(instruction *)insniter__._16_8_);
      insniter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_58);
    }
    bbiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&insn);
  }
  return;
}

Assistant:

static void clean_up_insns(struct dmr_C *C, struct entrypoint *ep)
{
	struct basic_block *bb;

	FOR_EACH_PTR(ep->bbs, bb) {
		struct instruction *insn;
		FOR_EACH_PTR(bb->insns, insn) {
			clean_up_one_instruction(C, bb, insn);
		} END_FOR_EACH_PTR(insn);
	} END_FOR_EACH_PTR(bb);
}